

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O1

int __thiscall lscpp::comm_logger::open(comm_logger *this,char *__file,int __oflag,...)

{
  long lVar1;
  size_t sVar2;
  char cVar3;
  ostream *poVar4;
  FILE *pFVar5;
  FILE *extraout_RAX;
  string name;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  long local_1a0 [2];
  undefined8 auStack_190 [12];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  sVar2 = this->msg_id_;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".lscpp/",7);
  *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 3;
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar1 + 1] == '\0') {
    cVar3 = std::ios::widen((char)(ostream *)local_1a0 + (char)lVar1);
    acStack_c0[lVar1] = cVar3;
    acStack_c0[lVar1 + 1] = '\x01';
  }
  acStack_c0[lVar1] = '0';
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,(int)sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1f0,local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  pFVar5 = fopen((char *)local_1d0,"w");
  this->cur_file_ = (FILE *)pFVar5;
  this->file_open_ = true;
  this->msg_id_ = this->msg_id_ + 1;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
    pFVar5 = extraout_RAX;
  }
  return (int)pFVar5;
}

Assistant:

void comm_logger::open(std::string suffix) {
  auto name = filename(msg_id_, suffix);
  cur_file_ = std::fopen(name.c_str(), "w");
  file_open_ = true;
  msg_id_++;
}